

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int32_t find_mb_rd_info(MB_RD_RECORD *mb_rd_record,int64_t ref_best_rd,uint32_t hash)

{
  int32_t iVar1;
  int index;
  int i;
  int32_t match_index;
  uint32_t hash_local;
  int64_t ref_best_rd_local;
  MB_RD_RECORD *mb_rd_record_local;
  
  match_index = -1;
  iVar1 = match_index;
  if (ref_best_rd != 0x7fffffffffffffff) {
    i = 0;
    while ((iVar1 = match_index, i < mb_rd_record->num &&
           (iVar1 = (mb_rd_record->index_start + i) % 8,
           mb_rd_record->mb_rd_info[iVar1].hash_value != hash))) {
      i = i + 1;
    }
  }
  match_index = iVar1;
  return match_index;
}

Assistant:

static inline int32_t find_mb_rd_info(const MB_RD_RECORD *const mb_rd_record,
                                      const int64_t ref_best_rd,
                                      const uint32_t hash) {
  int32_t match_index = -1;
  if (ref_best_rd != INT64_MAX) {
    for (int i = 0; i < mb_rd_record->num; ++i) {
      const int index = (mb_rd_record->index_start + i) % RD_RECORD_BUFFER_LEN;
      // If there is a match in the mb_rd_record, fetch the RD decision and
      // terminate early.
      if (mb_rd_record->mb_rd_info[index].hash_value == hash) {
        match_index = index;
        break;
      }
    }
  }
  return match_index;
}